

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flv.c
# Opt level: O2

int flv_read_tag(FILE *flv,flvtag_t *tag)

{
  uint8_t *puVar1;
  size_t sVar2;
  uint uVar3;
  uint uVar4;
  ulong __n;
  uint8_t h [11];
  
  sVar2 = fread(h,1,0xb,(FILE *)flv);
  uVar3 = 0;
  if (sVar2 == 0xb) {
    uVar4 = (uint)h[2] << 8 | (uint)h[1] << 0x10;
    uVar3 = h._3_4_ & 0xff;
    flvtag_reserve(tag,uVar4 + uVar3);
    puVar1 = tag->data;
    *(ulong *)puVar1 = CONCAT17(h[7],CONCAT43(h._3_4_,CONCAT12(h[2],CONCAT11(h[1],h[0]))));
    *(undefined4 *)(puVar1 + 7) = h._7_4_;
    __n = (ulong)(uVar4 + uVar3 + 4);
    sVar2 = fread(tag->data + 0xb,1,__n,(FILE *)flv);
    uVar3 = (uint)(sVar2 == __n);
  }
  return uVar3;
}

Assistant:

int flv_read_tag(FILE* flv, flvtag_t* tag)
{
    uint32_t size;
    uint8_t h[FLV_TAG_HEADER_SIZE];

    if (FLV_TAG_HEADER_SIZE != fread(&h[0], 1, FLV_TAG_HEADER_SIZE, flv)) {
        return 0;
    }

    size = ((h[1] << 16) | (h[2] << 8) | h[3]);
    flvtag_reserve(tag, size);
    // copy header to buffer
    memcpy(tag->data, &h[0], FLV_TAG_HEADER_SIZE);

    if (size + FLV_TAG_FOOTER_SIZE != fread(&tag->data[FLV_TAG_HEADER_SIZE], 1, size + FLV_TAG_FOOTER_SIZE, flv)) {
        return 0;
    }

    return 1;
}